

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

saucy * saucy_alloc(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int n_00;
  int n_01;
  int *piVar2;
  char *pcVar3;
  Vec_Int_t **ppVVar4;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  saucy *s;
  int n;
  int numins;
  int numouts;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPoNum(pNtk);
  n_00 = Abc_NtkPiNum(pNtk);
  n_01 = n_00 + iVar1;
  pNtk_local = (Abc_Ntk_t *)malloc(0x2b8);
  if ((saucy *)pNtk_local == (saucy *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->ninduce = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->sinduce = piVar2;
    pcVar3 = bits(n_01);
    ((saucy *)pNtk_local)->indmark = pcVar3;
    piVar2 = zeros(n_01);
    (((saucy *)pNtk_local)->left).cfront = piVar2;
    piVar2 = ints(n_01);
    (((saucy *)pNtk_local)->left).clen = piVar2;
    piVar2 = zeros(n_01);
    (((saucy *)pNtk_local)->right).cfront = piVar2;
    piVar2 = ints(n_01);
    (((saucy *)pNtk_local)->right).clen = piVar2;
    pcVar3 = bits(n_01 + 1);
    ((saucy *)pNtk_local)->stuff = pcVar3;
    piVar2 = ints(n_01 + 2);
    ((saucy *)pNtk_local)->bucket = piVar2;
    piVar2 = ints(n_01 + 1);
    ((saucy *)pNtk_local)->count = piVar2;
    piVar2 = zeros(n_01);
    ((saucy *)pNtk_local)->ccount = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->clist = piVar2;
    piVar2 = ints(n_01 + 1);
    ((saucy *)pNtk_local)->nextnon = piVar2 + 1;
    piVar2 = ints(n_01 + 1);
    ((saucy *)pNtk_local)->prevnon = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->anctar = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->start = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->gamma = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->junk = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->theta = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->thsize = piVar2;
    piVar2 = ints(n_01);
    (((saucy *)pNtk_local)->left).lab = piVar2;
    piVar2 = ints(n_01);
    (((saucy *)pNtk_local)->left).unlab = piVar2;
    piVar2 = ints(n_01);
    (((saucy *)pNtk_local)->right).lab = piVar2;
    piVar2 = ints(n_01);
    (((saucy *)pNtk_local)->right).unlab = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->splitvar = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->splitwho = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->splitfrom = piVar2;
    piVar2 = ints(n_01 + 1);
    ((saucy *)pNtk_local)->splitlev = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->unsupp = piVar2;
    piVar2 = zeros(n_01);
    ((saucy *)pNtk_local)->conncnts = piVar2;
    pcVar3 = bits(n_01);
    ((saucy *)pNtk_local)->diffmark = pcVar3;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->diffs = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->difflev = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->undifflev = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->specmin = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->thnext = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->thprev = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->threp = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->thfront = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->pairs = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->unpairs = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->diffnons = piVar2;
    piVar2 = ints(n_01);
    ((saucy *)pNtk_local)->undiffnons = piVar2;
    pcVar3 = bits(n_01);
    ((saucy *)pNtk_local)->marks = pcVar3;
    ppVVar4 = (Vec_Int_t **)malloc((long)n_00 << 3);
    ((saucy *)pNtk_local)->iDep = ppVVar4;
    ppVVar4 = (Vec_Int_t **)malloc((long)iVar1 << 3);
    ((saucy *)pNtk_local)->oDep = ppVVar4;
    ppVVar4 = (Vec_Int_t **)malloc((long)n_00 << 3);
    ((saucy *)pNtk_local)->obs = ppVVar4;
    ppVVar4 = (Vec_Int_t **)malloc((long)iVar1 << 3);
    ((saucy *)pNtk_local)->ctrl = ppVVar4;
    for (numins = 0; numins < n_00; numins = numins + 1) {
      pVVar5 = Vec_IntAlloc(1);
      ((saucy *)pNtk_local)->iDep[numins] = pVVar5;
      pVVar5 = Vec_IntAlloc(1);
      ((saucy *)pNtk_local)->obs[numins] = pVVar5;
    }
    for (numins = 0; numins < iVar1; numins = numins + 1) {
      pVVar5 = Vec_IntAlloc(1);
      ((saucy *)pNtk_local)->oDep[numins] = pVVar5;
      pVVar5 = Vec_IntAlloc(1);
      ((saucy *)pNtk_local)->ctrl[numins] = pVVar5;
    }
    pVVar6 = Vec_PtrAlloc(n_01);
    ((saucy *)pNtk_local)->randomVectorArray_sim1 = pVVar6;
    piVar2 = zeros(n_01);
    ((saucy *)pNtk_local)->randomVectorSplit_sim1 = piVar2;
    pVVar6 = Vec_PtrAlloc(n_01);
    ((saucy *)pNtk_local)->randomVectorArray_sim2 = pVVar6;
    piVar2 = zeros(n_01);
    ((saucy *)pNtk_local)->randomVectorSplit_sim2 = piVar2;
    pVVar6 = Vec_PtrAlloc(1);
    ((saucy *)pNtk_local)->satCounterExamples = pVVar6;
    piVar2 = ints(n_00);
    ((saucy *)pNtk_local)->pModel = piVar2;
    if (((((((saucy *)pNtk_local)->ninduce == (int *)0x0) ||
          (((saucy *)pNtk_local)->sinduce == (int *)0x0)) ||
         ((((saucy *)pNtk_local)->left).cfront == (int *)0x0)) ||
        ((((((saucy *)pNtk_local)->left).clen == (int *)0x0 ||
          ((((saucy *)pNtk_local)->right).cfront == (int *)0x0)) ||
         (((((saucy *)pNtk_local)->right).clen == (int *)0x0 ||
          ((((saucy *)pNtk_local)->stuff == (char *)0x0 ||
           (((saucy *)pNtk_local)->bucket == (int *)0x0)))))))) ||
       (((((((saucy *)pNtk_local)->count == (int *)0x0 ||
           ((((((saucy *)pNtk_local)->ccount == (int *)0x0 ||
              (((saucy *)pNtk_local)->clist == (int *)0x0)) ||
             (((saucy *)pNtk_local)->nextnon == (int *)0x4)) ||
            ((((saucy *)pNtk_local)->prevnon == (int *)0x0 ||
             (((saucy *)pNtk_local)->start == (int *)0x0)))))) ||
          ((((saucy *)pNtk_local)->gamma == (int *)0x0 ||
           ((((saucy *)pNtk_local)->theta == (int *)0x0 ||
            ((((saucy *)pNtk_local)->left).unlab == (int *)0x0)))))) ||
         ((((saucy *)pNtk_local)->right).lab == (int *)0x0)) ||
        ((((((((((saucy *)pNtk_local)->right).unlab == (int *)0x0 ||
              ((((saucy *)pNtk_local)->left).lab == (int *)0x0)) ||
             (((saucy *)pNtk_local)->splitvar == (int *)0x0)) ||
            ((((saucy *)pNtk_local)->splitwho == (int *)0x0 ||
             (((saucy *)pNtk_local)->junk == (int *)0x0)))) ||
           (((((saucy *)pNtk_local)->splitfrom == (int *)0x0 ||
             ((((saucy *)pNtk_local)->splitlev == (int *)0x0 ||
              (((saucy *)pNtk_local)->thsize == (int *)0x0)))) ||
            (((saucy *)pNtk_local)->unsupp == (int *)0x0)))) ||
          (((((saucy *)pNtk_local)->conncnts == (int *)0x0 ||
            (((saucy *)pNtk_local)->anctar == (int *)0x0)) ||
           (((saucy *)pNtk_local)->diffmark == (char *)0x0)))) ||
         ((((((saucy *)pNtk_local)->diffs == (int *)0x0 ||
            (((saucy *)pNtk_local)->indmark == (char *)0x0)) ||
           ((((saucy *)pNtk_local)->thnext == (int *)0x0 ||
            ((((saucy *)pNtk_local)->thprev == (int *)0x0 ||
             (((saucy *)pNtk_local)->threp == (int *)0x0)))))) ||
          ((((saucy *)pNtk_local)->thfront == (int *)0x0 ||
           (((((((saucy *)pNtk_local)->pairs == (int *)0x0 ||
               (((saucy *)pNtk_local)->unpairs == (int *)0x0)) ||
              (((saucy *)pNtk_local)->diffnons == (int *)0x0)) ||
             ((((saucy *)pNtk_local)->undiffnons == (int *)0x0 ||
              (((saucy *)pNtk_local)->difflev == (int *)0x0)))) ||
            ((((saucy *)pNtk_local)->undifflev == (int *)0x0 ||
             (((saucy *)pNtk_local)->specmin == (int *)0x0)))))))))))))) {
      saucy_free((saucy *)pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
  }
  return (saucy *)pNtk_local;
}

Assistant:

struct saucy *
saucy_alloc(Abc_Ntk_t * pNtk)
{
    int i;
    int numouts = Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);
    int n = numins + numouts;
    struct saucy *s = ABC_ALLOC(struct saucy, 1);
    if (s == NULL) return NULL;

    s->ninduce = ints(n);
    s->sinduce = ints(n);
    s->indmark = bits(n);
    s->left.cfront = zeros(n);
    s->left.clen = ints(n);
    s->right.cfront = zeros(n);
    s->right.clen = ints(n);
    s->stuff = bits(n+1);
    s->bucket = ints(n+2);
    s->count = ints(n+1);
    s->ccount = zeros(n);
    s->clist = ints(n);
    s->nextnon = ints(n+1) + 1;
    s->prevnon = ints(n+1);
    s->anctar = ints(n);
    s->start = ints(n);
    s->gamma = ints(n);
    s->junk = ints(n);
    s->theta = ints(n);
    s->thsize = ints(n);
    s->left.lab = ints(n);
    s->left.unlab = ints(n);
    s->right.lab = ints(n);
    s->right.unlab = ints(n);
    s->splitvar = ints(n);
    s->splitwho = ints(n);
    s->splitfrom = ints(n);
    s->splitlev = ints(n+1);
    s->unsupp = ints(n);
    s->conncnts = zeros(n);
    s->diffmark = bits(n);
    s->diffs = ints(n);
    s->difflev = ints(n);
    s->undifflev = ints(n);
    s->specmin = ints(n);
    s->thnext = ints(n);
    s->thprev = ints(n);
    s->threp = ints(n);
    s->thfront = ints(n);
    s->pairs = ints(n);
    s->unpairs = ints(n);
    s->diffnons = ints(n);
    s->undiffnons = ints(n);
    s->marks = bits(n);

    s->iDep = ABC_ALLOC( Vec_Int_t*,  numins );
    s->oDep = ABC_ALLOC( Vec_Int_t*,  numouts );
    s->obs  = ABC_ALLOC( Vec_Int_t*,  numins );
    s->ctrl = ABC_ALLOC( Vec_Int_t*,  numouts );

    for(i = 0; i < numins; i++) {       
        s->iDep[i] = Vec_IntAlloc( 1 );
        s->obs[i] = Vec_IntAlloc( 1 );
    }
    for(i = 0; i < numouts; i++) {      
        s->oDep[i] = Vec_IntAlloc( 1 );
        s->ctrl[i] = Vec_IntAlloc( 1 );
    }   

    s->randomVectorArray_sim1 = Vec_PtrAlloc( n );  
    s->randomVectorSplit_sim1 = zeros( n );
    s->randomVectorArray_sim2 = Vec_PtrAlloc( n );  
    s->randomVectorSplit_sim2= zeros( n );

    s->satCounterExamples = Vec_PtrAlloc( 1 );
    s->pModel = ints( numins );

    if (s->ninduce && s->sinduce && s->left.cfront && s->left.clen
        && s->right.cfront && s->right.clen
        && s->stuff && s->bucket && s->count && s->ccount
        && s->clist && s->nextnon-1 && s->prevnon
        && s->start && s->gamma && s->theta && s->left.unlab
        && s->right.lab && s->right.unlab
        && s->left.lab &&  s->splitvar && s->splitwho && s->junk
        && s->splitfrom && s->splitlev && s->thsize
        && s->unsupp && s->conncnts && s->anctar
        && s->diffmark && s->diffs && s->indmark
        && s->thnext && s->thprev && s->threp && s->thfront
        && s->pairs && s->unpairs && s->diffnons && s->undiffnons
        && s->difflev && s->undifflev && s->specmin)
    {
        return s;
    }
    else {
        saucy_free(s);
        return NULL;
    }
}